

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_GLSL_POW(Context *ctx)

{
  size_t in_RCX;
  char src1 [64];
  char src0 [64];
  char code [128];
  
  make_GLSL_srcarg_string_masked(ctx,0,src0,in_RCX);
  make_GLSL_srcarg_string_masked(ctx,1,src1,in_RCX);
  make_GLSL_destarg_assign(ctx,code,0x80,"pow(abs(%s), %s)",src0,src1);
  output_line(ctx,"%s",code);
  return;
}

Assistant:

static void emit_GLSL_POW(Context *ctx)
{
    char src0[64]; make_GLSL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_GLSL_srcarg_string_masked(ctx, 1, src1, sizeof (src1));
    char code[128];
    make_GLSL_destarg_assign(ctx, code, sizeof (code),
                             "pow(abs(%s), %s)", src0, src1);
    output_line(ctx, "%s", code);
}